

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O3

void different_stl_string_pointers_are_not_equal(void)

{
  string *psVar1;
  string *psVar2;
  Constraint_ *pCVar3;
  
  psVar1 = (string *)operator_new(0x20);
  (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)psVar1,"bob","");
  bob_pointer_abi_cxx11_ = psVar1;
  psVar2 = (string *)operator_new(0x20);
  (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)psVar2,"alice","");
  psVar1 = bob_pointer_abi_cxx11_;
  alice_pointer_abi_cxx11_ = psVar2;
  pCVar3 = (Constraint_ *)
           cgreen::create_not_equal_to_string_constraint((string *)psVar2,"alice_pointer");
  cgreen::assert_that_
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/cpp_assertion_tests.cpp"
             ,0x7d,"bob_pointer",(string *)psVar1,pCVar3);
  return;
}

Assistant:

Ensure(different_stl_string_pointers_are_not_equal) {
    bob_pointer = new std::string("bob");
    alice_pointer = new std::string("alice");

    assert_that(bob_pointer, is_not_equal_to_string(alice_pointer));
}